

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::ConfidentialTransactionContext::IgnoreVerify
          (ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  OutPoint *pOVar1;
  bool bVar2;
  uint32_t uVar3;
  OutPoint *object;
  bool bVar4;
  Txid local_48;
  
  core::OutPoint::GetTxid(&local_48,outpoint);
  uVar3 = core::OutPoint::GetVout(outpoint);
  (*(this->super_ConfidentialTransaction).super_AbstractTransaction._vptr_AbstractTransaction[2])
            (this,&local_48,(ulong)uVar3);
  local_48._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  object = (this->verify_ignore_map_).
           super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar1 = (this->verify_ignore_map_).
           super__Vector_base<cfd::core::OutPoint,_std::allocator<cfd::core::OutPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar4 = object != pOVar1;
  if (bVar4) {
    bVar2 = core::OutPoint::operator==(outpoint,object);
    while (!bVar2) {
      object = object + 1;
      bVar4 = object != pOVar1;
      if (object == pOVar1) break;
      bVar2 = core::OutPoint::operator==(outpoint,object);
    }
  }
  if (!bVar4) {
    std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
    emplace_back<cfd::core::OutPoint_const&>
              ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)
               &this->verify_ignore_map_,outpoint);
  }
  return;
}

Assistant:

void ConfidentialTransactionContext::IgnoreVerify(const OutPoint& outpoint) {
  GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  if (!IsFindOutPoint(verify_ignore_map_, outpoint)) {
    verify_ignore_map_.emplace_back(outpoint);
  }
}